

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O3

void print<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
                *m)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">: ",3);
    print<std::vector<Employee,_std::allocator<Employee>_>_>
              ((vector<Employee,_std::allocator<Employee>_> *)(p_Var2 + 2));
  }
  return;
}

Assistant:

void print(const std::map<Key, Value>& m)
{
    for(const auto& [key, value] : m)
    {
        std::cout << "<" << key << ">: ";
        print(value);
    }
}